

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall SimpleStringBuffer::add(SimpleStringBuffer *this,char *format,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  ulong uVar2;
  undefined8 in_RDX;
  long lVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arguments;
  __va_list_tag local_d8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  lVar3 = this->write_limit_ - this->positions_filled_;
  if (lVar3 != 0) {
    local_d8.reg_save_area = local_b8;
    local_d8.overflow_arg_area = &arguments[0].overflow_arg_area;
    local_d8.gp_offset = 0x10;
    local_d8.fp_offset = 0x30;
    local_a8 = in_RDX;
    local_a0 = in_RCX;
    local_98 = in_R8;
    local_90 = in_R9;
    uVar1 = (*PlatformSpecificVSNprintf)
                      (this->buffer_ + this->positions_filled_,lVar3 + 1,format,&local_d8);
    uVar2 = this->positions_filled_;
    if (0 < (int)uVar1) {
      uVar2 = uVar2 + uVar1;
      this->positions_filled_ = uVar2;
    }
    if (this->write_limit_ < uVar2) {
      this->positions_filled_ = this->write_limit_;
    }
  }
  return;
}

Assistant:

void SimpleStringBuffer::add(const char* format, ...)
{
    const size_t positions_left = write_limit_ - positions_filled_;
    if (positions_left == 0) return;

    va_list arguments;
    va_start(arguments, format);
    const int count = PlatformSpecificVSNprintf(buffer_ + positions_filled_, positions_left+1, format, arguments);
    if (count > 0) positions_filled_ += (size_t) count;
    if (positions_filled_ > write_limit_) positions_filled_ = write_limit_;
    va_end(arguments);
}